

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mesh.cpp
# Opt level: O0

BBox * __thiscall CGL::GLScene::Mesh::get_bbox(Mesh *this)

{
  bool bVar1;
  pointer pVVar2;
  HalfedgeMesh *in_RDI;
  BBox *in_stack_00000020;
  VertexIter it;
  BBox *bbox;
  HalfedgeMesh *this_00;
  undefined8 in_stack_ffffffffffffffc8;
  undefined8 in_stack_ffffffffffffffd0;
  _Self local_20;
  _Self local_18 [3];
  
  this_00 = in_RDI;
  BBox::BBox(in_stack_00000020);
  local_18[0]._M_node = (_List_node_base *)HalfedgeMesh::verticesBegin(this_00);
  while( true ) {
    local_20._M_node = (_List_node_base *)HalfedgeMesh::verticesEnd(this_00);
    bVar1 = std::operator!=(local_18,&local_20);
    if (!bVar1) break;
    pVVar2 = std::_List_iterator<CGL::Vertex>::operator->((_List_iterator<CGL::Vertex> *)0x130764);
    Vector3D::Vector3D((Vector3D *)&stack0xffffffffffffffb8,&pVVar2->position);
    BBox::expand((BBox *)in_stack_ffffffffffffffd0,(Vector3D *)in_stack_ffffffffffffffc8);
    std::_List_iterator<CGL::Vertex>::operator++(local_18,0);
  }
  return (BBox *)in_RDI;
}

Assistant:

BBox Mesh::get_bbox() {
  BBox bbox;
  for (VertexIter it = mesh.verticesBegin(); it != mesh.verticesEnd(); it++) {
    bbox.expand(it->position);
  }
  return bbox;
}